

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O1

ze_result_t loader::zesDriverGet(uint32_t *pCount,zes_driver_handle_t *phDrivers)

{
  _ze_driver_handle_t **_params;
  byte bVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  ze_result_t zVar5;
  long *plVar6;
  undefined8 *puVar7;
  object_t<_ze_driver_handle_t_*> *poVar8;
  ulong uVar9;
  uint uVar10;
  pthread_once_t *__once_control;
  long lVar11;
  uint32_t library_driver_handle_count;
  uint local_58;
  uint local_54;
  zes_driver_handle_t *local_50;
  uint *local_48;
  ulong local_40;
  dditable_t *local_38;
  
  LOCK();
  bVar1 = *(byte *)(context + 0x165c);
  *(byte *)(context + 0x165c) = 1;
  UNLOCK();
  local_50 = phDrivers;
  if (((bVar1 & 1) == 0) && (*(char *)(context + 0x165d) == '\0')) {
    __once_control = (pthread_once_t *)(context + 0x1658);
    local_38 = (dditable_t *)&stack0xffffffffffffffa8;
    plVar6 = (long *)__tls_get_addr(&PTR_001f6c58);
    *plVar6 = (long)&stack0xffffffffffffffc8;
    puVar7 = (undefined8 *)__tls_get_addr(&PTR_001f6d80);
    *puVar7 = std::once_flag::_Prepare_execution::
              _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
              ::anon_class_1_0_00000001::__invoke;
    iVar4 = pthread_once(__once_control,__once_proxy);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    *plVar6 = 0;
    *puVar7 = 0;
    LOCK();
    *(undefined1 *)(context + 0x165c) = 0;
    UNLOCK();
  }
  lVar11 = **(long **)(context + 0x1610);
  lVar3 = (*(long **)(context + 0x1610))[1];
  if (lVar11 == lVar3) {
    uVar10 = 0;
    zVar5 = ZE_RESULT_SUCCESS;
  }
  else {
    zVar5 = ZE_RESULT_SUCCESS;
    uVar9 = 0;
    do {
      uVar10 = (uint)uVar9;
      iVar4 = 3;
      if ((*(int *)(lVar11 + 0xc) == 0 && *(int *)(lVar11 + 8) == 0) &&
         ((*pCount == 0 || (iVar4 = 2, *pCount != uVar10)))) {
        local_58 = 0;
        zVar5 = (**(code **)(lVar11 + 0x9f0))(&stack0xffffffffffffffa8,0);
        if (zVar5 == ZE_RESULT_SUCCESS) {
          iVar4 = 0;
          if ((local_50 != (zes_driver_handle_t *)0x0) && (uVar2 = *pCount, uVar2 != 0)) {
            if (uVar2 < local_58 + uVar10) {
              local_58 = uVar2 - uVar10;
            }
            zVar5 = (**(code **)(lVar11 + 0x9f0))(&stack0xffffffffffffffa8);
            if (zVar5 != ZE_RESULT_SUCCESS) {
              iVar4 = 2;
              goto LAB_001be89e;
            }
            *(undefined1 *)(lVar11 + 0xd60) = 1;
            local_40 = uVar9;
            if (local_58 != 0) {
              uVar9 = 0;
              local_54 = uVar10;
              local_48 = pCount;
              do {
                _params = local_50 + (uint)((int)local_40 + (int)uVar9);
                local_38 = (dditable_t *)(lVar11 + 0x18);
                poVar8 = singleton_factory_t<object_t<_ze_driver_handle_t*>,_ze_driver_handle_t*>::
                         getInstance<_ze_driver_handle_t*&,dditable_t*>
                                   ((singleton_factory_t<object_t<_ze_driver_handle_t*>,_ze_driver_handle_t*>
                                     *)(context + 0x8a0),_params,&stack0xffffffffffffffc8);
                *_params = (_ze_driver_handle_t *)poVar8;
                uVar9 = uVar9 + 1;
                pCount = local_48;
                uVar10 = local_54;
              } while (uVar9 < local_58);
            }
          }
          zVar5 = ZE_RESULT_SUCCESS;
          uVar9 = (ulong)(uVar10 + local_58);
        }
        else {
          iVar4 = 3;
          if (zVar5 == ZE_RESULT_ERROR_UNINITIALIZED) {
            *(undefined4 *)(lVar11 + 8) = 0x78000001;
          }
        }
      }
LAB_001be89e:
      uVar10 = (uint)uVar9;
    } while (((iVar4 == 3) || (iVar4 == 0)) && (lVar11 = lVar11 + 0xd98, lVar11 != lVar3));
  }
  if ((zVar5 == ZE_RESULT_SUCCESS) || (uVar10 != 0)) {
    *pCount = uVar10;
  }
  if (uVar10 != 0) {
    zVar5 = ZE_RESULT_SUCCESS;
  }
  return zVar5;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDriverGet(
        uint32_t* pCount,                               ///< [in,out] pointer to the number of sysman driver instances.
                                                        ///< if count is zero, then the loader shall update the value with the
                                                        ///< total number of sysman drivers available.
                                                        ///< if count is greater than the number of sysman drivers available, then
                                                        ///< the loader shall update the value with the correct number of sysman
                                                        ///< drivers available.
        zes_driver_handle_t* phDrivers                  ///< [in,out][optional][range(0, *pCount)] array of sysman driver instance handles.
                                                        ///< if count is less than the number of sysman drivers available, then the
                                                        ///< loader shall only retrieve that number of sysman drivers.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        uint32_t total_driver_handle_count = 0;

        if (!loader::context->sortingInProgress.exchange(true) && !loader::context->instrumentationEnabled) {
            std::call_once(loader::context->sysmanDriverSortOnce, []() {
                loader::context->driverSorting(loader::context->sysmanInstanceDrivers, nullptr, true);
            });
            loader::context->sortingInProgress.store(false);
        }

        for( auto& drv : *loader::context->sysmanInstanceDrivers )
        {
            if(drv.initStatus != ZE_RESULT_SUCCESS || drv.initSysManStatus != ZE_RESULT_SUCCESS)
                continue;

            if( ( 0 < *pCount ) && ( *pCount == total_driver_handle_count))
                break;

            uint32_t library_driver_handle_count = 0;

            result = drv.dditable.zes.Driver.pfnGet( &library_driver_handle_count, nullptr );
            if( ZE_RESULT_SUCCESS != result ) {
                // If Get Drivers fails with Uninitialized, then update the driver init status to prevent reporting this driver in the next get call.
                if (ZE_RESULT_ERROR_UNINITIALIZED == result) {
                    drv.initStatus = result;
                }
                continue;
            }

            if( nullptr != phDrivers && *pCount !=0)
            {
                if( total_driver_handle_count + library_driver_handle_count > *pCount) {
                    library_driver_handle_count = *pCount - total_driver_handle_count;
                }
                result = drv.dditable.zes.Driver.pfnGet( &library_driver_handle_count, &phDrivers[ total_driver_handle_count ] );
                if( ZE_RESULT_SUCCESS != result ) break;

                drv.driverInuse = true;

                try
                {
                    for( uint32_t i = 0; i < library_driver_handle_count; ++i ) {
                        uint32_t driver_index = total_driver_handle_count + i;
                        phDrivers[ driver_index ] = reinterpret_cast<zes_driver_handle_t>(
                            context->zes_driver_factory.getInstance( phDrivers[ driver_index ], &drv.dditable ) );
                    }
                }
                catch( std::bad_alloc& )
                {
                    result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
                }
            }

            total_driver_handle_count += library_driver_handle_count;
        }

        // If the last driver get failed, but at least one driver succeeded, then return success with total count.
        if( ZE_RESULT_SUCCESS == result || total_driver_handle_count > 0)
            *pCount = total_driver_handle_count;
        if (total_driver_handle_count > 0) {
            result = ZE_RESULT_SUCCESS;
        }

        return result;
    }